

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

Block * __thiscall
wasm::I64ToI32Lowering::lowerBitwise
          (I64ToI32Lowering *this,BinaryOp op,Block *result,TempVar *leftLow,TempVar *leftHigh,
          TempVar *rightLow,TempVar *rightHigh)

{
  Id IVar1;
  TempVar *pTVar2;
  Builder *pBVar3;
  I64ToI32Lowering *pIVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  Binary *pBVar7;
  LocalSet *pLVar8;
  Block *pBVar9;
  Block *local_70;
  TempVar *local_68;
  Block *local_60;
  ulong local_58;
  Builder *local_50;
  TempVar *local_48;
  LocalSet *local_40;
  I64ToI32Lowering *local_38;
  
  local_38 = this;
  if (2 < op - AndInt64) {
    abort();
  }
  if (rightHigh->moved != true) {
    local_68 = rightLow;
    local_60 = result;
    local_48 = leftLow;
    if (leftHigh->moved != true) {
      local_50 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      local_40 = (LocalSet *)CONCAT44(local_40._4_4_,rightHigh->idx);
      IVar1 = leftHigh->idx;
      pEVar5 = (Expression *)MixedArena::allocSpace(&local_50->wasm->allocator,0x18,8);
      pEVar5->_id = LocalGetId;
      pEVar5[1]._id = IVar1;
      (pEVar5->type).id = 2;
      if (rightHigh->moved != true) {
        IVar1 = rightHigh->idx;
        pEVar6 = (Expression *)
                 MixedArena::allocSpace
                           (&((local_38->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                             allocator,0x18,8);
        pBVar3 = local_50;
        pEVar6->_id = LocalGetId;
        pEVar6[1]._id = IVar1;
        (pEVar6->type).id = 2;
        pBVar7 = (Binary *)MixedArena::allocSpace(&local_50->wasm->allocator,0x28,8);
        (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId
        ;
        (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar7->op = op - AddInt64;
        pBVar7->left = pEVar5;
        pBVar7->right = pEVar6;
        local_58 = (ulong)(op - AddInt64);
        Binary::finalize(pBVar7);
        pLVar8 = Builder::makeLocalSet(pBVar3,(Index)local_40,(Expression *)pBVar7);
        if (local_48->moved != true) {
          pTVar2 = (TempVar *)
                   (local_38->builder)._M_t.
                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                   super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
          IVar1 = local_48->idx;
          local_48 = pTVar2;
          local_40 = pLVar8;
          pEVar5 = (Expression *)
                   MixedArena::allocSpace((MixedArena *)(*(long *)&pTVar2->idx + 0x158),0x18,8);
          pIVar4 = local_38;
          pEVar5->_id = LocalGetId;
          pEVar5[1]._id = IVar1;
          (pEVar5->type).id = 2;
          if (local_68->moved != true) {
            IVar1 = local_68->idx;
            pEVar6 = (Expression *)
                     MixedArena::allocSpace
                               (&((local_38->builder)._M_t.
                                  super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                  .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm
                                 ->allocator,0x18,8);
            pEVar6->_id = LocalGetId;
            pEVar6[1]._id = IVar1;
            (pEVar6->type).id = 2;
            pBVar7 = (Binary *)
                     MixedArena::allocSpace((MixedArena *)(*(long *)&local_48->idx + 0x158),0x28,8);
            (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
                 BinaryId;
            (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
                 0;
            pBVar7->op = (BinaryOp)local_58;
            pBVar7->left = pEVar5;
            pBVar7->right = pEVar6;
            Binary::finalize(pBVar7);
            pBVar3 = local_50;
            pBVar9 = Builder::blockify(local_50,(Expression *)local_60,(Expression *)local_40);
            pBVar9 = Builder::blockify(pBVar3,(Expression *)pBVar9,(Expression *)pBVar7);
            local_70 = pBVar9;
            std::
            _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                      ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&pIVar4->highBitVars,&local_70,rightHigh);
            return pBVar9;
          }
        }
      }
    }
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4c,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

Block* lowerBitwise(BinaryOp op,
                      Block* result,
                      TempVar&& leftLow,
                      TempVar&& leftHigh,
                      TempVar&& rightLow,
                      TempVar&& rightHigh) {
    BinaryOp op32;
    switch (op) {
      case AndInt64:
        op32 = AndInt32;
        break;
      case OrInt64:
        op32 = OrInt32;
        break;
      case XorInt64:
        op32 = XorInt32;
        break;
      default:
        abort();
    }
    result = builder->blockify(
      result,
      builder->makeLocalSet(
        rightHigh,
        builder->makeBinary(op32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeLocalGet(rightHigh, Type::i32))),
      builder->makeBinary(op32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    setOutParam(result, std::move(rightHigh));
    return result;
  }